

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts5ExprSynonymList(Fts5ExprTerm *pTerm,i64 iRowid,Fts5Buffer *pBuf,u8 **pa,int *pn)

{
  undefined8 *puVar1;
  Fts5IndexIter *pFVar2;
  u8 *a;
  int iVar3;
  int iVar4;
  undefined8 *__dest;
  long lVar5;
  long lVar6;
  long iPos;
  i64 *piOff;
  ulong uVar7;
  ulong uVar8;
  long in_FS_OFFSET;
  Fts5PoslistWriter writer;
  Fts5PoslistReader aStatic [4];
  undefined8 *local_f0;
  int local_e8;
  Fts5PoslistWriter local_c0;
  undefined4 local_b8;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  undefined4 local_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined4 local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = 0xaaaaaaaa;
  uStack_44 = 0xaaaaaaaa;
  uStack_40 = 0xaaaaaaaa;
  uStack_3c = 0xaaaaaaaa;
  local_58 = 0xaaaaaaaa;
  uStack_54 = 0xaaaaaaaa;
  uStack_50 = 0xaaaaaaaa;
  uStack_4c = 0xaaaaaaaa;
  local_68 = 0xaaaaaaaa;
  uStack_64 = 0xaaaaaaaa;
  uStack_60 = 0xaaaaaaaa;
  uStack_5c = 0xaaaaaaaa;
  local_78 = 0xaaaaaaaa;
  uStack_74 = 0xaaaaaaaa;
  uStack_70 = 0xaaaaaaaa;
  uStack_6c = 0xaaaaaaaa;
  local_88 = 0xaaaaaaaa;
  uStack_84 = 0xaaaaaaaa;
  uStack_80 = 0xaaaaaaaa;
  uStack_7c = 0xaaaaaaaa;
  local_98 = 0xaaaaaaaa;
  uStack_94 = 0xaaaaaaaa;
  uStack_90 = 0xaaaaaaaa;
  uStack_8c = 0xaaaaaaaa;
  local_a8 = 0xaaaaaaaa;
  uStack_a4 = 0xaaaaaaaa;
  uStack_a0 = 0xaaaaaaaa;
  uStack_9c = 0xaaaaaaaa;
  local_b8 = 0xaaaaaaaa;
  uStack_b4 = 0xaaaaaaaa;
  uStack_b0 = 0xaaaaaaaa;
  uStack_ac = 0xaaaaaaaa;
  if (pTerm == (Fts5ExprTerm *)0x0) {
    local_f0 = (undefined8 *)&local_b8;
    uVar7 = 0;
  }
  else {
    local_e8 = 4;
    uVar7 = 0;
    local_f0 = (undefined8 *)&local_b8;
    do {
      pFVar2 = pTerm->pIter;
      if (((pFVar2->bEof == '\0') && (pFVar2->iRowid == iRowid)) && (pFVar2->nData != 0)) {
        iVar4 = (int)uVar7;
        __dest = local_f0;
        if (iVar4 == local_e8) {
          iVar3 = sqlite3_initialize();
          if (iVar3 == 0) {
            __dest = (undefined8 *)sqlite3Malloc((long)iVar4 << 6);
            if (__dest != (undefined8 *)0x0) {
              memcpy(__dest,local_f0,(long)iVar4 << 5);
              local_e8 = iVar4 * 2;
              if (local_f0 != (undefined8 *)&local_b8) {
                sqlite3_free(local_f0);
              }
              goto LAB_001e1e80;
            }
          }
          iVar4 = 7;
          goto LAB_001e1ff5;
        }
LAB_001e1e80:
        lVar6 = (long)iVar4;
        a = pFVar2->pData;
        iVar3 = pFVar2->nData;
        puVar1 = __dest + lVar6 * 4;
        *puVar1 = 0;
        puVar1[1] = 0;
        puVar1[2] = 0;
        puVar1[3] = 0;
        *puVar1 = a;
        *(int *)(puVar1 + 1) = iVar3;
        iVar3 = sqlite3Fts5PoslistNext64(a,iVar3,(int *)((long)puVar1 + 0xc),__dest + lVar6 * 4 + 3)
        ;
        if (iVar3 != 0) {
          *(undefined1 *)((long)__dest + lVar6 * 0x20 + 0x11) = 1;
        }
        uVar7 = (ulong)(iVar4 + 1);
        local_f0 = __dest;
      }
      pTerm = pTerm->pSynonym;
    } while (pTerm != (Fts5ExprTerm *)0x0);
    if ((int)uVar7 == 1) {
      *pa = (u8 *)*local_f0;
      *pn = *(int *)(local_f0 + 1);
      iVar4 = 0;
      goto LAB_001e1ff5;
    }
  }
  iVar4 = 0;
  local_c0.iPrev = 0;
  pBuf->n = 0;
  if (0 < (int)uVar7) {
    iVar4 = 0;
    lVar6 = -1;
    do {
      iPos = 0x7fffffffffffffff;
      piOff = local_f0 + 3;
      uVar8 = uVar7;
      do {
        if (*(char *)((long)piOff + -7) == '\0') {
          lVar5 = *piOff;
          if (lVar5 == lVar6) {
            iVar3 = sqlite3Fts5PoslistNext64
                              ((u8 *)piOff[-3],(int)piOff[-2],(int *)((long)piOff + -0xc),piOff);
            if (iVar3 == 0) {
              if (*(char *)((long)piOff + -7) == '\0') {
                lVar5 = *piOff;
                goto LAB_001e1f8f;
              }
            }
            else {
              *(undefined1 *)((long)piOff + -7) = 1;
            }
          }
          else {
LAB_001e1f8f:
            if (lVar5 < iPos) {
              iPos = lVar5;
            }
          }
        }
        piOff = piOff + 4;
        uVar8 = uVar8 - 1;
      } while (uVar8 != 0);
    } while (((iPos != 0x7fffffffffffffff) && (iVar4 == 0)) &&
            (iVar4 = sqlite3Fts5PoslistWriterAppend(pBuf,&local_c0,iPos), lVar6 = iPos,
            0 < (int)uVar7));
  }
  if (iVar4 == 0) {
    *pa = pBuf->p;
    *pn = pBuf->n;
  }
LAB_001e1ff5:
  if (local_f0 != (undefined8 *)&local_b8) {
    sqlite3_free(local_f0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar4;
}

Assistant:

static int fts5ExprSynonymList(
  Fts5ExprTerm *pTerm,
  i64 iRowid,
  Fts5Buffer *pBuf,               /* Use this buffer for space if required */
  u8 **pa, int *pn
){
  Fts5PoslistReader aStatic[4];
  Fts5PoslistReader *aIter = aStatic;
  int nIter = 0;
  int nAlloc = 4;
  int rc = SQLITE_OK;
  Fts5ExprTerm *p;

  assert( pTerm->pSynonym );
  for(p=pTerm; p; p=p->pSynonym){
    Fts5IndexIter *pIter = p->pIter;
    if( sqlite3Fts5IterEof(pIter)==0 && pIter->iRowid==iRowid ){
      if( pIter->nData==0 ) continue;
      if( nIter==nAlloc ){
        sqlite3_int64 nByte = sizeof(Fts5PoslistReader) * nAlloc * 2;
        Fts5PoslistReader *aNew = (Fts5PoslistReader*)sqlite3_malloc64(nByte);
        if( aNew==0 ){
          rc = SQLITE_NOMEM;
          goto synonym_poslist_out;
        }
        memcpy(aNew, aIter, sizeof(Fts5PoslistReader) * nIter);
        nAlloc = nAlloc*2;
        if( aIter!=aStatic ) sqlite3_free(aIter);
        aIter = aNew;
      }
      sqlite3Fts5PoslistReaderInit(pIter->pData, pIter->nData, &aIter[nIter]);
      assert( aIter[nIter].bEof==0 );
      nIter++;
    }
  }

  if( nIter==1 ){
    *pa = (u8*)aIter[0].a;
    *pn = aIter[0].n;
  }else{
    Fts5PoslistWriter writer = {0};
    i64 iPrev = -1;
    fts5BufferZero(pBuf);
    while( 1 ){
      int i;
      i64 iMin = FTS5_LARGEST_INT64;
      for(i=0; i<nIter; i++){
        if( aIter[i].bEof==0 ){
          if( aIter[i].iPos==iPrev ){
            if( sqlite3Fts5PoslistReaderNext(&aIter[i]) ) continue;
          }
          if( aIter[i].iPos<iMin ){
            iMin = aIter[i].iPos;
          }
        }
      }
      if( iMin==FTS5_LARGEST_INT64 || rc!=SQLITE_OK ) break;
      rc = sqlite3Fts5PoslistWriterAppend(pBuf, &writer, iMin);
      iPrev = iMin;
    }
    if( rc==SQLITE_OK ){
      *pa = pBuf->p;
      *pn = pBuf->n;
    }
  }

 synonym_poslist_out:
  if( aIter!=aStatic ) sqlite3_free(aIter);
  return rc;
}